

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite_sinusoidal_modeling_to_autocorrelation.cc
# Opt level: O2

bool __thiscall
sptk::CompositeSinusoidalModelingToAutocorrelation::Run
          (CompositeSinusoidalModelingToAutocorrelation *this,
          vector<double,_std::allocator<double>_> *composite_sinusoidal_modeling,
          vector<double,_std::allocator<double>_> *autocorrelation)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  size_type __new_size;
  int i;
  long lVar7;
  pointer pdVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  pointer local_48;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar3 = false;
  if (autocorrelation != (vector<double,_std::allocator<double>_> *)0x0) {
    iVar4 = this->num_sine_wave_;
    uVar2 = iVar4 * 2;
    pdVar8 = (composite_sinusoidal_modeling->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(composite_sinusoidal_modeling->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar8;
    __new_size = lVar5 >> 3;
    bVar3 = false;
    if (__new_size == (long)(int)uVar2) {
      local_48 = (autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      if ((long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)local_48 != lVar5) {
        std::vector<double,_std::allocator<double>_>::resize(autocorrelation,__new_size);
        pdVar8 = (composite_sinusoidal_modeling->super__Vector_base<double,_std::allocator<double>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar4 = this->num_sine_wave_;
        local_48 = (autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
      }
      lVar5 = (long)iVar4;
      uVar9 = 0;
      uVar6 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar6 = uVar9;
      }
      for (; uVar9 != uVar6; uVar9 = uVar9 + 1) {
        dVar10 = 0.0;
        for (lVar7 = 0; lVar7 < iVar4; lVar7 = lVar7 + 1) {
          dVar1 = pdVar8[lVar5 + lVar7];
          dVar11 = cos(pdVar8[lVar7] * (double)(int)uVar9);
          dVar10 = dVar10 + dVar11 * dVar1;
          iVar4 = this->num_sine_wave_;
        }
        local_48[uVar9] = dVar10;
      }
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool CompositeSinusoidalModelingToAutocorrelation::Run(
    const std::vector<double>& composite_sinusoidal_modeling,
    std::vector<double>* autocorrelation) const {
  // Check inputs.
  const int length(num_sine_wave_ * 2);
  if (!is_valid_ ||
      composite_sinusoidal_modeling.size() !=
          static_cast<std::size_t>(length) ||
      NULL == autocorrelation) {
    return false;
  }

  // Prepare memories.
  if (autocorrelation->size() != static_cast<std::size_t>(length)) {
    autocorrelation->resize(length);
  }

  const double* frequencies(&(composite_sinusoidal_modeling[0]));
  const double* intensities(&(composite_sinusoidal_modeling[num_sine_wave_]));
  double* v(&((*autocorrelation)[0]));

  // Calculate autocorrelation using Eq. (2).
  for (int l(0); l < length; ++l) {
    double sum(0.0);
    for (int i(0); i < num_sine_wave_; ++i) {
      sum += intensities[i] * std::cos(l * frequencies[i]);
    }
    v[l] = sum;
  }

  return true;
}